

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O0

Ivy_Obj_t ** Ivy_ObjNextFanoutPlace(Ivy_Obj_t *pObj,Ivy_Obj_t *pFanout)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pFanout_local;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                  ,0x3b,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_IsComplement(pFanout);
  if (iVar1 == 0) {
    pIVar2 = Ivy_ObjFanin0(pFanout);
    if (pIVar2 == pObj) {
      pObj_local = (Ivy_Obj_t *)&pFanout->pNextFan0;
    }
    else {
      pIVar2 = Ivy_ObjFanin1(pFanout);
      if (pIVar2 != pObj) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                      ,0x3f,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      pObj_local = (Ivy_Obj_t *)&pFanout->pNextFan1;
    }
    return (Ivy_Obj_t **)pObj_local;
  }
  __assert_fail("!Ivy_IsComplement(pFanout)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                ,0x3c,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

static inline Ivy_Obj_t ** Ivy_ObjNextFanoutPlace( Ivy_Obj_t * pObj, Ivy_Obj_t * pFanout )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_IsComplement(pFanout) );
    if ( Ivy_ObjFanin0(pFanout) == pObj )
        return &pFanout->pNextFan0;
    assert( Ivy_ObjFanin1(pFanout) == pObj );
    return &pFanout->pNextFan1;
}